

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormaps.cpp
# Opt level: O2

void R_SetDefaultColormap(char *name)

{
  BYTE *pBVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  FDynamicColormap foo;
  BYTE remap [256];
  BYTE unremap [256];
  BYTE map [256];
  
  iVar2 = strncasecmp((fakecmaps.Array)->name,name,8);
  if (iVar2 != 0) {
    iVar2 = FWadCollection::CheckNumForFullName(&Wads,name,true,3);
    if ((((iVar2 == -1) && (iVar2 = FWadCollection::CheckNumForName(&Wads,name,0), iVar2 == -1)) ||
        (iVar3 = FWadCollection::CheckNumForFullName(&Wads,"palette.dat",false,0), -1 < iVar3)) ||
       (iVar3 = FWadCollection::CheckNumForFullName(&Wads,"blood.pal",false,0), -1 < iVar3)) {
      Printf("Make colormap\n");
      foo.Color.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0xffffff;
      foo.Fade.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
      foo.Maps = realcolormaps;
      foo.Desaturate = 0;
      foo.Next = (FDynamicColormap *)0x0;
      FDynamicColormap::BuildLights(&foo);
    }
    else {
      FWadCollection::OpenLumpNum((FWadLump *)&foo,&Wads,iVar2);
      memcpy(remap,GPalette.Remap,0x100);
      memset(unremap,0,0x100);
      for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
        unremap[remap[lVar6]] = (BYTE)lVar6;
      }
      remap[0] = '\0';
      lVar6 = 0;
      for (lVar5 = 0; pBVar1 = realcolormaps, lVar5 != 0x20; lVar5 = lVar5 + 1) {
        FWadLump::Read((FWadLump *)&foo,map,0x100);
        for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
          pBVar1[lVar4 + lVar6] = remap[map[unremap[lVar4]]];
        }
        lVar6 = lVar6 + 0x100;
      }
      FWadLump::~FWadLump((FWadLump *)&foo);
    }
    uppercopy((fakecmaps.Array)->name,name);
    ((fakecmaps.Array)->blend).field_0.d = 0;
    return;
  }
  return;
}

Assistant:

void R_SetDefaultColormap (const char *name)
{
	if (strnicmp (fakecmaps[0].name, name, 8) != 0)
	{
		int lump, i, j;
		BYTE map[256];
		BYTE unremap[256];
		BYTE remap[256];

		lump = Wads.CheckNumForFullName (name, true, ns_colormaps);
		if (lump == -1)
			lump = Wads.CheckNumForName (name, ns_global);

		// [RH] If using BUILD's palette, generate the colormap
		if (lump == -1 || Wads.CheckNumForFullName("palette.dat") >= 0 || Wads.CheckNumForFullName("blood.pal") >= 0)
		{
			Printf ("Make colormap\n");
			FDynamicColormap foo;

			foo.Color = 0xFFFFFF;
			foo.Fade = 0;
			foo.Maps = realcolormaps;
			foo.Desaturate = 0;
			foo.Next = NULL;
			foo.BuildLights ();
		}
		else
		{
			FWadLump lumpr = Wads.OpenLumpNum (lump);

			// [RH] The colormap may not have been designed for the specific
			// palette we are using, so remap it to match the current palette.
			memcpy (remap, GPalette.Remap, 256);
			memset (unremap, 0, 256);
			for (i = 0; i < 256; ++i)
			{
				unremap[remap[i]] = i;
			}
			// Mapping to color 0 is okay, because the colormap won't be used to
			// produce a masked texture.
			remap[0] = 0;
			for (i = 0; i < NUMCOLORMAPS; ++i)
			{
				BYTE *map2 = &realcolormaps[i*256];
				lumpr.Read (map, 256);
				for (j = 0; j < 256; ++j)
				{
					map2[j] = remap[map[unremap[j]]];
				}
			}
		}

		uppercopy (fakecmaps[0].name, name);
		fakecmaps[0].blend = 0;
	}
}